

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::JoinHashTable::ScanStructure::NextMarkJoin
          (ScanStructure *this,DataChunk *keys,DataChunk *left,DataChunk *result)

{
  DataChunk *groups;
  JoinHashTable *pJVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  _Head_base<0UL,_bool_*,_false> _Var6;
  reference pvVar7;
  reference pvVar8;
  pointer this_00;
  ulong uVar9;
  idx_t i_1;
  DataChunk *result_00;
  ValidityMask *this_01;
  idx_t i;
  ulong uVar10;
  bool bVar11;
  UnifiedVectorFormat kdata;
  
  ScanKeyMatches(this,keys);
  pJVar1 = this->ht;
  if ((pJVar1->correlated_mark_join_info).correlated_types.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (pJVar1->correlated_mark_join_info).correlated_types.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ConstructMarkJoinResult(this,keys,left,result);
  }
  else {
    ::std::mutex::lock(&(pJVar1->correlated_mark_join_info).mj_lock);
    groups = &(pJVar1->correlated_mark_join_info).group_chunk;
    (pJVar1->correlated_mark_join_info).group_chunk.count = keys->count;
    for (uVar10 = 0;
        uVar10 < (ulong)(((long)*(pointer *)
                                 ((long)&(pJVar1->correlated_mark_join_info).group_chunk.data.
                                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                         .
                                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                         ._M_impl.super__Vector_impl_data + 8) -
                         (long)(pJVar1->correlated_mark_join_info).group_chunk.data.
                               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x68);
        uVar10 = uVar10 + 1) {
      pvVar7 = vector<duckdb::Vector,_true>::get<true>(&groups->data,uVar10);
      pvVar8 = vector<duckdb::Vector,_true>::get<true>(&keys->data,uVar10);
      Vector::Reference(pvVar7,pvVar8);
    }
    this_00 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
              ::operator->(&(pJVar1->correlated_mark_join_info).correlated_counts);
    result_00 = &(pJVar1->correlated_mark_join_info).result_chunk;
    GroupedAggregateHashTable::FetchAggregates(this_00,groups,result_00);
    result->count = left->count;
    for (uVar10 = 0;
        uVar10 < (ulong)(((long)(left->data).
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(left->data).
                               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x68);
        uVar10 = uVar10 + 1) {
      pvVar7 = vector<duckdb::Vector,_true>::get<true>(&result->data,uVar10);
      pvVar8 = vector<duckdb::Vector,_true>::get<true>(&left->data,uVar10);
      Vector::Reference(pvVar7,pvVar8);
    }
    pvVar7 = vector<duckdb::Vector,_true>::back(&keys->data);
    pvVar8 = vector<duckdb::Vector,_true>::back(&result->data);
    Vector::SetVectorType(pvVar8,FLAT_VECTOR);
    pdVar2 = pvVar8->data;
    FlatVector::VerifyFlatVector(pvVar8);
    this_01 = &pvVar8->validity;
    if (pvVar7->vector_type == FLAT_VECTOR) {
      FlatVector::VerifyFlatVector(pvVar7);
      TemplatedValidityMask<unsigned_long>::Copy
                (&this_01->super_TemplatedValidityMask<unsigned_long>,
                 &(pvVar7->validity).super_TemplatedValidityMask<unsigned_long>,left->count);
    }
    else if (pvVar7->vector_type == CONSTANT_VECTOR) {
      puVar3 = (pvVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
        TemplatedValidityMask<unsigned_long>::SetAllInvalid
                  (&this_01->super_TemplatedValidityMask<unsigned_long>,left->count);
      }
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat(&kdata);
      Vector::ToUnifiedFormat(pvVar7,keys->count,&kdata);
      for (uVar10 = 0; uVar10 < left->count; uVar10 = uVar10 + 1) {
        uVar9 = uVar10;
        if ((kdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)(kdata.sel)->sel_vector[uVar10];
        }
        if (kdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar11 = true;
        }
        else {
          bVar11 = (kdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0;
        }
        TemplatedValidityMask<unsigned_long>::Set
                  (&this_01->super_TemplatedValidityMask<unsigned_long>,uVar10,bVar11);
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&kdata);
    }
    pvVar7 = vector<duckdb::Vector,_true>::get<true>(&result_00->data,0);
    pdVar4 = pvVar7->data;
    pvVar7 = vector<duckdb::Vector,_true>::get<true>(&result_00->data,1);
    pdVar5 = pvVar7->data;
    for (uVar10 = 0; uVar10 < left->count; uVar10 = uVar10 + 1) {
      _Var6._M_head_impl =
           (this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
           super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
           super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
           super__Head_base<0UL,_bool_*,_false>._M_head_impl;
      if (_Var6._M_head_impl == (bool *)0x0) {
        pdVar2[uVar10] = '\0';
LAB_01952d0f:
        if (*(long *)(pdVar5 + uVar10 * 8) < *(long *)(pdVar4 + uVar10 * 8)) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&this_01->super_TemplatedValidityMask<unsigned_long>,uVar10);
        }
      }
      else {
        bVar11 = _Var6._M_head_impl[uVar10];
        pdVar2[uVar10] = bVar11;
        if (bVar11 == false) goto LAB_01952d0f;
      }
      if (*(long *)(pdVar4 + uVar10 * 8) == 0) {
        TemplatedValidityMask<unsigned_long>::SetValid
                  (&this_01->super_TemplatedValidityMask<unsigned_long>,uVar10);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&pJVar1->correlated_mark_join_info);
  }
  this->finished = true;
  return;
}

Assistant:

void ScanStructure::NextMarkJoin(DataChunk &keys, DataChunk &left, DataChunk &result) {
	D_ASSERT(result.ColumnCount() == left.ColumnCount() + 1);
	D_ASSERT(result.data.back().GetType() == LogicalType::BOOLEAN);
	// this method should only be called for a non-empty HT
	D_ASSERT(ht.Count() > 0);

	ScanKeyMatches(keys);
	if (ht.correlated_mark_join_info.correlated_types.empty()) {
		ConstructMarkJoinResult(keys, left, result);
	} else {
		auto &info = ht.correlated_mark_join_info;
		lock_guard<mutex> mj_lock(info.mj_lock);

		// there are correlated columns
		// first we fetch the counts from the aggregate hashtable corresponding to these entries
		D_ASSERT(keys.ColumnCount() == info.group_chunk.ColumnCount() + 1);
		info.group_chunk.SetCardinality(keys);
		for (idx_t i = 0; i < info.group_chunk.ColumnCount(); i++) {
			info.group_chunk.data[i].Reference(keys.data[i]);
		}
		info.correlated_counts->FetchAggregates(info.group_chunk, info.result_chunk);

		// for the initial set of columns we just reference the left side
		result.SetCardinality(left);
		for (idx_t i = 0; i < left.ColumnCount(); i++) {
			result.data[i].Reference(left.data[i]);
		}
		// create the result matching vector
		auto &last_key = keys.data.back();
		auto &result_vector = result.data.back();
		// first set the nullmask based on whether or not there were NULL values in the join key
		result_vector.SetVectorType(VectorType::FLAT_VECTOR);
		auto bool_result = FlatVector::GetData<bool>(result_vector);
		auto &mask = FlatVector::Validity(result_vector);
		switch (last_key.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR:
			if (ConstantVector::IsNull(last_key)) {
				mask.SetAllInvalid(left.size());
			}
			break;
		case VectorType::FLAT_VECTOR:
			mask.Copy(FlatVector::Validity(last_key), left.size());
			break;
		default: {
			UnifiedVectorFormat kdata;
			last_key.ToUnifiedFormat(keys.size(), kdata);
			for (idx_t i = 0; i < left.size(); i++) {
				auto kidx = kdata.sel->get_index(i);
				mask.Set(i, kdata.validity.RowIsValid(kidx));
			}
			break;
		}
		}

		auto count_star = FlatVector::GetData<int64_t>(info.result_chunk.data[0]);
		auto count = FlatVector::GetData<int64_t>(info.result_chunk.data[1]);
		// set the entries to either true or false based on whether a match was found
		for (idx_t i = 0; i < left.size(); i++) {
			D_ASSERT(count_star[i] >= count[i]);
			bool_result[i] = found_match ? found_match[i] : false;
			if (!bool_result[i] && count_star[i] > count[i]) {
				// RHS has NULL value and result is false: set to null
				mask.SetInvalid(i);
			}
			if (count_star[i] == 0) {
				// count == 0, set nullmask to false (we know the result is false now)
				mask.SetValid(i);
			}
		}
	}
	finished = true;
}